

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::internal::TracingMuxerImpl::SetBatchCommitsDurationForTesting
          (TracingMuxerImpl *this,uint32_t batch_commits_duration_ms,BackendType backend_type)

{
  pointer pRVar1;
  ProducerImpl *pPVar2;
  long *plVar3;
  RegisteredBackend *backend;
  pointer pRVar4;
  
  pRVar1 = (this->backends_).
           super__Vector_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pRVar4 = (this->backends_).
                super__Vector_base<perfetto::internal::TracingMuxerImpl::RegisteredBackend,_std::allocator<perfetto::internal::TracingMuxerImpl::RegisteredBackend>_>
                ._M_impl.super__Vector_impl_data._M_start; pRVar4 != pRVar1; pRVar4 = pRVar4 + 1) {
    pPVar2 = (pRVar4->producer)._M_t.
             super___uniq_ptr_impl<perfetto::internal::TracingMuxerImpl::ProducerImpl,_std::default_delete<perfetto::internal::TracingMuxerImpl::ProducerImpl>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::internal::TracingMuxerImpl::ProducerImpl_*,_std::default_delete<perfetto::internal::TracingMuxerImpl::ProducerImpl>_>
             .super__Head_base<0UL,_perfetto::internal::TracingMuxerImpl::ProducerImpl_*,_false>.
             _M_head_impl;
    if (((pPVar2 != (ProducerImpl *)0x0) && (pPVar2->connected_ == true)) &&
       (pRVar4->type == backend_type)) {
      plVar3 = (long *)(**(code **)(*(long *)(pPVar2->service_).
                                             super___shared_ptr<perfetto::ProducerEndpoint,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + 0x58))();
      (**(code **)(*plVar3 + 0x40))(plVar3,batch_commits_duration_ms);
    }
  }
  return;
}

Assistant:

void TracingMuxerImpl::SetBatchCommitsDurationForTesting(
    uint32_t batch_commits_duration_ms,
    BackendType backend_type) {
  for (RegisteredBackend& backend : backends_) {
    if (backend.producer && backend.producer->connected_ &&
        backend.type == backend_type) {
      backend.producer->service_->MaybeSharedMemoryArbiter()
          ->SetBatchCommitsDuration(batch_commits_duration_ms);
    }
  }
}